

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cluster.cpp
# Opt level: O2

MPP_RET cluster_worker_deinit(ClusterWorker *p)

{
  MppThread *this;
  undefined8 in_RAX;
  undefined8 uVar1;
  undefined4 uVar2;
  
  uVar2 = (undefined4)((ulong)in_RAX >> 0x20);
  if (p->thd != (MppThread *)0x0) {
    MppThread::stop(p->thd);
    this = p->thd;
    if (this != (MppThread *)0x0) {
      MppThread::~MppThread(this);
    }
    operator_delete(this,0x198);
    p->thd = (MppThread *)0x0;
  }
  if ((p->list_task).next != &p->list_task) {
    uVar1 = CONCAT44(uVar2,0x184);
    _mpp_log_l(2,"mpp_cluster","Assertion %s failed at %s:%d\n",(char *)0x0,
               "list_empty(&p->list_task)","cluster_worker_deinit",uVar1);
    uVar2 = (undefined4)((ulong)uVar1 >> 0x20);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00154690;
  }
  if (p->work_count != 0) {
    _mpp_log_l(2,"mpp_cluster","Assertion %s failed at %s:%d\n",(char *)0x0,"p->work_count == 0",
               "cluster_worker_deinit",CONCAT44(uVar2,0x185));
    if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00154690:
      abort();
    }
  }
  p->batch_count = 0;
  p->cluster = (MppCluster *)0x0;
  return MPP_OK;
}

Assistant:

MPP_RET cluster_worker_deinit(ClusterWorker *p)
{
    if (p->thd) {
        p->thd->stop();
        delete p->thd;
        p->thd = NULL;
    }

    mpp_assert(list_empty(&p->list_task));
    mpp_assert(p->work_count == 0);

    p->batch_count = 0;
    p->cluster = NULL;

    return MPP_OK;
}